

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmldoc.cpp
# Opt level: O3

XmlNodePtr __thiscall libcellml::XmlDoc::rootNode(XmlDoc *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined8 *in_RSI;
  undefined1 auVar2 [16];
  XmlNodePtr XVar3;
  xmlNodePtr root;
  undefined1 local_29;
  xmlNodePtr local_28;
  XmlDoc local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  auVar2 = xmlDocGetRootElement(*(undefined8 *)*in_RSI);
  _Var1._M_pi = auVar2._8_8_;
  local_28 = auVar2._0_8_;
  this->mPimpl = (XmlDocImpl *)0x0;
  this[1].mPimpl = (XmlDocImpl *)0x0;
  if (local_28 != (xmlNodePtr)0x0) {
    local_20.mPimpl = (XmlDocImpl *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<libcellml::XmlNode,std::allocator<libcellml::XmlNode>>
              (&local_18,(XmlNode **)&local_20,(allocator<libcellml::XmlNode> *)&local_29);
    this->mPimpl = (XmlDocImpl *)local_20;
    this[1].mPimpl = (XmlDocImpl *)local_18._M_pi;
    XmlNode::setXmlNode((XmlNode *)local_20.mPimpl,&local_28);
    _Var1._M_pi = extraout_RDX;
  }
  XVar3.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  XVar3.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (XmlNodePtr)XVar3.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

XmlNodePtr XmlDoc::rootNode() const
{
    xmlNodePtr root = xmlDocGetRootElement(mPimpl->mXmlDocPtr);
    XmlNodePtr rootHandle = nullptr;
    if (root != nullptr) {
        rootHandle = std::make_shared<XmlNode>();
        rootHandle->setXmlNode(root);
    }
    return rootHandle;
}